

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::LookupTable
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  undefined4 in_stack_00000008;
  undefined8 in_stack_00000018;
  undefined4 in_stack_fffffffffffffe64;
  FunctionTask *in_stack_fffffffffffffe70;
  Image *out_00;
  uint32_t in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe84;
  Image *in_stack_fffffffffffffe88;
  FunctionTask *in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb8;
  
  out_00 = (Image *)&stack0xfffffffffffffe90;
  FunctionTask::FunctionTask(in_stack_fffffffffffffe70);
  FunctionTask::LookupTable
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,out_00,in_stack_00000018._4_4_,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  FunctionTask::~FunctionTask((FunctionTask *)CONCAT44(in_stack_fffffffffffffe64,in_stack_00000008))
  ;
  return;
}

Assistant:

void LookupTable( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                      uint32_t width, uint32_t height, const std::vector < uint8_t > & table )
    {
        return FunctionTask().LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, table );
    }